

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O0

void __thiscall
Rml::PropertySpecification::PropertySpecification
          (PropertySpecification *this,size_t reserve_num_properties,size_t reserve_num_shorthands)

{
  size_type __n;
  allocator<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>_>
  local_35 [20];
  allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>
  local_21;
  size_t local_20;
  size_t reserve_num_shorthands_local;
  size_t reserve_num_properties_local;
  PropertySpecification *this_local;
  
  local_20 = reserve_num_shorthands;
  reserve_num_shorthands_local = reserve_num_properties;
  reserve_num_properties_local = (size_t)this;
  ::std::
  allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>
  ::allocator(&local_21);
  ::std::
  vector<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ::vector(&this->properties,reserve_num_properties + 1,&local_21);
  ::std::
  allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>
  ::~allocator(&local_21);
  __n = local_20 + 1;
  ::std::
  allocator<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>_>
  ::allocator(local_35);
  ::std::
  vector<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>,_std::allocator<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>_>_>
  ::vector(&this->shorthands,__n,local_35);
  ::std::
  allocator<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>_>
  ::~allocator(local_35);
  MakeUnique<Rml::PropertyIdNameMap,unsigned_long>((unsigned_long *)&this->property_map);
  MakeUnique<Rml::ShorthandIdNameMap,unsigned_long>((unsigned_long *)&this->shorthand_map);
  PropertyIdSet::PropertyIdSet(&this->property_ids);
  PropertyIdSet::PropertyIdSet(&this->property_ids_inherited);
  PropertyIdSet::PropertyIdSet(&this->property_ids_forcing_layout);
  return;
}

Assistant:

PropertySpecification::PropertySpecification(size_t reserve_num_properties, size_t reserve_num_shorthands) :
	// Increment reserve numbers by one because the 'invalid' property occupies the first element
	properties(reserve_num_properties + 1), shorthands(reserve_num_shorthands + 1),
	property_map(MakeUnique<PropertyIdNameMap>(reserve_num_properties + 1)), shorthand_map(MakeUnique<ShorthandIdNameMap>(reserve_num_shorthands + 1))
{}